

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O3

void __thiscall
chrono::ChLoadXYZnodeBody::ChLoadXYZnodeBody(ChLoadXYZnodeBody *this,ChLoadXYZnodeBody *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  ChObj::ChObj((ChObj *)this,(ChObj *)param_1);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.jacobians =
       (param_1->super_ChLoadCustomMultiple).super_ChLoadBase.jacobians;
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_00b20e70;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::vector(&(this->super_ChLoadCustomMultiple).loadables,
           &(param_1->super_ChLoadCustomMultiple).loadables);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&(this->super_ChLoadCustomMultiple).load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)&(param_1->super_ChLoadCustomMultiple).load_Q);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZnodeBody_00b21b28;
  (this->loc_application_B)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->loc_application_B).coord.pos.m_data[0] = (param_1->loc_application_B).coord.pos.m_data[0];
  (this->loc_application_B).coord.pos.m_data[1] = (param_1->loc_application_B).coord.pos.m_data[1];
  (this->loc_application_B).coord.pos.m_data[2] = (param_1->loc_application_B).coord.pos.m_data[2];
  (this->loc_application_B).coord.rot.m_data[0] = (param_1->loc_application_B).coord.rot.m_data[0];
  (this->loc_application_B).coord.rot.m_data[1] = (param_1->loc_application_B).coord.rot.m_data[1];
  (this->loc_application_B).coord.rot.m_data[2] = (param_1->loc_application_B).coord.rot.m_data[2];
  (this->loc_application_B).coord.rot.m_data[3] = (param_1->loc_application_B).coord.rot.m_data[3];
  dVar1 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 8);
  dVar2 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x10);
  dVar3 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x18);
  dVar4 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x20);
  dVar5 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x28);
  dVar6 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x30);
  dVar7 = *(double *)
           ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x38);
  (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       dVar1;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = dVar2;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = dVar3;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = dVar4;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = dVar5;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = dVar6;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = dVar7;
  *(double *)
   ((long)(this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = *(double *)
        ((long)(param_1->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  (this->computed_loc_force).m_data[0] = (param_1->computed_loc_force).m_data[0];
  (this->computed_loc_force).m_data[1] = (param_1->computed_loc_force).m_data[1];
  (this->computed_loc_force).m_data[2] = (param_1->computed_loc_force).m_data[2];
  ChFrameMoving<double>::ChFrameMoving(&this->frame_Aw,&param_1->frame_Aw);
  ChFrameMoving<double>::ChFrameMoving(&this->frame_Bw,&param_1->frame_Bw);
  return;
}

Assistant:

class ChApi ChLoadXYZnodeBody : public ChLoadCustomMultiple {
  public:
    ChLoadXYZnodeBody   (std::shared_ptr<ChNodeXYZ> nodeA,    ///< node
						 std::shared_ptr<ChBody> bodyB        ///< body 
    );

    /// Compute the force on the nodeA, in local coordsystem of SetApplicationFrameB (the 
	/// auxiliary frame attached to body) given relative position of nodeA respect to B
    /// Body will receive the reaction force.
    /// Inherited classes MUST IMPLEMENT THIS.
    virtual void ComputeForce(const ChFrameMoving<>& rel_AB,
                               ChVector<>& loc_force) = 0;

    // Optional: inherited classes could implement this to avoid the
    // default numerical computation of jacobians:
    //   virtual void ComputeJacobian(...) // see ChLoad

    /// For diagnosis purposes, this can return the actual last computed value of
    /// the applied force, expressed in coordinate system of loc_application_B, assumed applied to node.
    ChVector<> GetForce() const { return computed_loc_force; }

    /// Set the application frame of bushing on bodyB
    void SetApplicationFrameB(const ChFrame<>& mpB) { loc_application_B = mpB; }
    ChFrame<> GetApplicationFrameB() const { return loc_application_B; }

    /// Get absolute coordinate of frame B (last computed)
    ChFrameMoving<> GetAbsoluteFrameB() const { return frame_Bw; }

    std::shared_ptr<ChNodeXYZ> GetNodeA() const;
    std::shared_ptr<ChBody> GetBodyB() const;

  protected:
    ChFrame<> loc_application_B;  ///< application point on body B (local)
    ChVector<> computed_loc_force;  ///< store computed values here
    ChFrameMoving<> frame_Aw;     ///< for results
    ChFrameMoving<> frame_Bw;     ///< for results

    /// Compute Q, the generalized load. It calls ComputeBodyBodyForceTorque, so in
    /// children classes you do not need to implement it.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;
}